

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

bool test_SSTable_behavior(void)

{
  pointer pSVar1;
  SSTableHeader *pSVar2;
  SSTableIndex *pSVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  bool bVar6;
  initializer_list<SSTableDataEntry> __l;
  SSTableData data;
  SSTable s;
  allocator_type local_131;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> local_130;
  SSTableDataEntry local_118;
  SSTableDataEntry local_d8;
  SSTableDataEntry local_98;
  SSTableDataEntry local_58;
  
  SSTableDataEntry::SSTableDataEntry(&local_118,false,0xbc614e,1,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_d8,false,0x75bc702,2,"LLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_98,true,0x4840e3f3,3,"");
  SSTableDataEntry::SSTableDataEntry(&local_58,false,0x75998cb,4,"NIMO");
  __l._M_len = 4;
  __l._M_array = &local_118;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            (&local_130,__l,&local_131);
  lVar4 = -0x100;
  paVar5 = &local_58.value.field_2;
  do {
    if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar5->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar5->_M_allocated_capacity)[-2],paVar5->_M_allocated_capacity + 1
                     );
    }
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar5->_M_allocated_capacity + -8);
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0);
  SSTable::SSTable((SSTable *)&local_118);
  SSTable::fillData((SSTable *)&local_118,&local_130);
  pSVar2 = SSTable::getHeader((SSTable *)&local_118);
  if ((((pSVar2->key_min == 1) && (pSVar2->entries_count == 4)) && (pSVar2->key_max == 4)) &&
     (pSVar2->index_offset == 0x99)) {
    pSVar3 = SSTable::getIndex((SSTable *)&local_118);
    pSVar1 = (pSVar3->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (((((pSVar1->key == 1) && (pSVar1->offset == 0x20)) &&
         ((pSVar1[1].key == 2 && ((pSVar1[1].offset == 0x45 && (pSVar1[2].key == 3)))))) &&
        (pSVar1[2].offset == 99)) && (pSVar1[3].key == 4)) {
      bVar6 = pSVar1[3].offset == 0x7c;
      goto LAB_0010443f;
    }
  }
  bVar6 = false;
LAB_0010443f:
  SSTable::~SSTable((SSTable *)&local_118);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&local_130);
  return bVar6;
}

Assistant:

bool test_SSTable_behavior() {
    auto data = SSTableData{
            {false, 12345678,   1, "Hello,World!"},
            {false, 123455234,  2, "LLLLL"},
            {true,  1212212211, 3, ""},
            {false, 123312331,  4, "NIMO"}
    };
    auto s = SSTable{};
    s.fillData(data);

    auto *h = s.getHeader();

    if (h->key_min != 1 || h->entries_count != 4 || h->key_max != 4 || h->index_offset != 32 + (25 * 4 + 12 + 5 + 4)) {
        return false;
    }

    auto &index = *s.getIndex();

    if (
            index[0].key != 1 ||
            index[0].offset != 32 ||
            index[1].key != 2 ||
            index[1].offset != 69 ||
            index[2].key != 3 ||
            index[2].offset != 99 ||
            index[3].key != 4 ||
            index[3].offset != 124
            ) {
        return false;
    }

    return true;
}